

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O1

TimingOf<std::chrono::_V2::steady_clock,_Catch::Benchmark::Detail::repeater<Catch::Benchmark::now<std::chrono::_V2::steady_clock>_>,_run_for_at_least_argument_t<steady_clock,_repeater<now<steady_clock>_>_>_>
 Catch::Benchmark::Detail::
 run_for_at_least<std::chrono::_V2::steady_clock,Catch::Benchmark::Detail::repeater<Catch::Benchmark::now<std::chrono::_V2::steady_clock>>>
           (ClockDuration<std::chrono::_V2::steady_clock> how_long,int seed,
           repeater<Catch::Benchmark::now<std::chrono::_V2::steady_clock>_> *fun)

{
  uint uVar1;
  TimingOf<std::chrono::_V2::steady_clock,_Catch::Benchmark::Detail::repeater<Catch::Benchmark::now<std::chrono::_V2::steady_clock>_>_&,_int_&>
  TVar2;
  TimingOf<std::chrono::_V2::steady_clock,_Catch::Benchmark::Detail::repeater<Catch::Benchmark::now<std::chrono::_V2::steady_clock>_>,_run_for_at_least_argument_t<steady_clock,_repeater<now<steady_clock>_>_>_>
  TVar3;
  uint local_3c;
  optimized_away_error local_38;
  
  do {
    uVar1 = seed;
    if (0x3fffffff < (int)uVar1) {
      local_38 = (optimized_away_error)&PTR__exception_001da588;
      throw_exception<Catch::Benchmark::Detail::optimized_away_error>(&local_38);
    }
    local_3c = uVar1;
    TVar2 = measure<std::chrono::_V2::steady_clock,Catch::Benchmark::Detail::repeater<Catch::Benchmark::now<std::chrono::_V2::steady_clock>>&,int&>
                      (fun,(int *)&local_3c);
    TVar3.elapsed = TVar2.elapsed.__r;
    seed = uVar1 << (TVar3.elapsed.__r < how_long.__r);
  } while (TVar3.elapsed.__r < how_long.__r);
  TVar3._8_8_ = (ulong)uVar1 << 0x20;
  return TVar3;
}

Assistant:

TimingOf<Clock, Fun, run_for_at_least_argument_t<Clock, Fun>> run_for_at_least(ClockDuration<Clock> how_long, int seed, Fun&& fun) {
                auto iters = seed;
                while (iters < (1 << 30)) {
                    auto&& Timing = measure_one<Clock>(fun, iters, is_callable<Fun(Chronometer)>());

                    if (Timing.elapsed >= how_long) {
                        return { Timing.elapsed, std::move(Timing.result), iters };
                    }
                    iters *= 2;
                }
                Catch::throw_exception(optimized_away_error{});
            }